

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O0

ssize_t __thiscall cppwinrt::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  ConstantType CVar1;
  int value;
  uint value_00;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  invalid_argument *this_00;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  Constant *this_01;
  Constant *value_local;
  writer *this_local;
  
  this_01 = (Constant *)CONCAT44(in_register_00000034,__fd);
  CVar1 = winmd::reader::Constant::Type(this_01);
  if (CVar1 == Int32) {
    value = winmd::reader::Constant::ValueInt32(this_01);
    write_value(this,value);
    sVar2 = extraout_RAX;
  }
  else {
    if (CVar1 != UInt32) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument(this_00,"Unexpected constant type");
      __cxa_throw(this_00,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
    value_00 = winmd::reader::Constant::ValueUInt32(this_01);
    write_value(this,value_00);
    sVar2 = extraout_RAX_00;
  }
  return sVar2;
}

Assistant:

void write(Constant const& value)
        {
            switch (value.Type())
            {
            case ConstantType::Int32:
                write_value(value.ValueInt32());
                break;
            case ConstantType::UInt32:
                write_value(value.ValueUInt32());
                break;
            default:
                throw std::invalid_argument("Unexpected constant type");
            }
        }